

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O0

CloudNode * Cloud_Support(CloudManager *dd,CloudNode *n)

{
  int *support_00;
  int local_2c;
  int i;
  int *support;
  CloudNode *res;
  CloudNode *n_local;
  CloudManager *dd_local;
  
  if ((n < dd->tUnique) || (dd->tUnique + dd->nNodesAlloc <= n)) {
    __assert_fail("(n) >= dd->tUnique && (n) < dd->tUnique+dd->nNodesAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/cloud.c"
                  ,0x26f,"CloudNode *Cloud_Support(CloudManager *, CloudNode *)");
  }
  support_00 = (int *)calloc((long)dd->nVars,4);
  cloudSupport(dd,(CloudNode *)((ulong)n & 0xfffffffffffffffe),support_00);
  cloudClearMark(dd,(CloudNode *)((ulong)n & 0xfffffffffffffffe));
  support = (int *)dd->one;
  local_2c = dd->nVars;
  do {
    local_2c = local_2c + -1;
    if (local_2c < 0) break;
  } while ((support_00[local_2c] != 1) ||
          (support = (int *)Cloud_bddAnd(dd,(CloudNode *)support,dd->vars[local_2c]),
          (CloudNode *)support != (CloudNode *)0x0));
  if (support_00 != (int *)0x0) {
    free(support_00);
  }
  return (CloudNode *)support;
}

Assistant:

CloudNode * Cloud_Support( CloudManager * dd, CloudNode * n )
{
    CloudNode * res;
    int * support, i;

    CLOUD_ASSERT(n);

    // allocate and initialize support array for cloudSupport
    support = ABC_CALLOC( int, dd->nVars );

    // compute support and clean up markers
    cloudSupport( dd, Cloud_Regular(n), support );
    cloudClearMark( dd, Cloud_Regular(n) );

    // transform support from array to cube
    res = dd->one;
    for ( i = dd->nVars - 1; i >= 0; i-- ) // for each level bottom-up 
        if ( support[i] == 1 )
        {
            res = Cloud_bddAnd( dd, res, dd->vars[i] );
            if ( res == NULL )
                break;
        }
    ABC_FREE( support );
    return res;
}